

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::suf::Kind>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::suf::Kind,int>>
               (tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
                *matchers,tuple<fmt::BasicStringRef<char>,_mp::suf::Kind,_int> *values,ostream *os)

{
  BasicStringRef<char> x;
  bool bVar1;
  ostream *this;
  ostream *in_RDX;
  tuple<fmt::BasicStringRef<char>,_mp::suf::Kind,_int> *in_RSI;
  tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
  *in_RDI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  StringMatchResultListener *in_stack_fffffffffffffdb8;
  StringMatchResultListener *in_stack_fffffffffffffdc0;
  MatchResultListener *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  char *in_stack_fffffffffffffdd8;
  StringMatchResultListener *in_stack_fffffffffffffde0;
  
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::suf::Kind>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::suf::Kind,int>>
            (in_RDI,in_RSI,in_RDX);
  std::
  get<0ul,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::suf::Kind>,testing::Matcher<int>>
            ((tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
              *)0x1b6579);
  Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)in_stack_fffffffffffffdc0,
             (Matcher<fmt::BasicStringRef<char>_> *)in_stack_fffffffffffffdb8);
  std::get<0ul,fmt::BasicStringRef<char>,mp::suf::Kind,int>
            ((tuple<fmt::BasicStringRef<char>,_mp::suf::Kind,_int> *)0x1b6596);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffde0);
  x.size_ = (size_t)in_stack_fffffffffffffde0;
  x.data_ = in_stack_fffffffffffffdd8;
  bVar1 = MatcherBase<fmt::BasicStringRef<char>_>::MatchAndExplain
                    ((MatcherBase<fmt::BasicStringRef<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),x,
                     in_stack_fffffffffffffdc8);
  if (!bVar1) {
    this = std::operator<<(in_RDX,"  Expected arg #");
    in_stack_fffffffffffffdc0 = (StringMatchResultListener *)std::ostream::operator<<(this,0);
    std::operator<<((ostream *)in_stack_fffffffffffffdc0,": ");
    std::
    get<0ul,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::suf::Kind>,testing::Matcher<int>>
              ((tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
                *)0x1b663a);
    MatcherBase<fmt::BasicStringRef<char>_>::DescribeTo
              ((MatcherBase<fmt::BasicStringRef<char>_> *)in_stack_fffffffffffffdc0,
               (ostream *)in_stack_fffffffffffffdb8);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<fmt::BasicStringRef<char>>
              ((BasicStringRef<char> *)in_stack_fffffffffffffdc0,
               (ostream *)in_stack_fffffffffffffdb8);
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffdb8);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdc0,(ostream *)in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdc0);
  Matcher<fmt::BasicStringRef<char>_>::~Matcher((Matcher<fmt::BasicStringRef<char>_> *)0x1b6711);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }